

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.h
# Opt level: O0

int __thiscall CCommandManager::RemoveCommand(CCommandManager *this,char *pCommand)

{
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  CCommand *pCVar4;
  array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_> *in_RDI;
  int i;
  code *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar5;
  int local_1c;
  
  local_1c = 0;
  while( true ) {
    iVar5 = local_1c;
    iVar3 = array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_>::size
                      (in_RDI);
    if (iVar3 <= iVar5) {
      return 1;
    }
    array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_>::operator[]
              (in_RDI,local_1c);
    iVar3 = str_comp((char *)CONCAT44(iVar5,in_stack_ffffffffffffffd0),
                     (char *)in_stack_ffffffffffffffc8);
    if (iVar3 == 0) break;
    local_1c = local_1c + 1;
  }
  lVar1._0_4_ = in_RDI[2].list_size;
  lVar1._4_4_ = in_RDI[2].num_elements;
  if (lVar1 != 0) {
    in_stack_ffffffffffffffc8 = *(code **)&in_RDI[2].list_size;
    pCVar4 = array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_>::
             operator[](in_RDI,local_1c);
    uVar2._0_4_ = in_RDI[1].list_size;
    uVar2._4_4_ = in_RDI[1].num_elements;
    (*in_stack_ffffffffffffffc8)(pCVar4,uVar2);
  }
  array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_>::remove_index
            ((array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_> *)
             CONCAT44(iVar5,in_stack_ffffffffffffffd0),
             (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  return 0;
}

Assistant:

int RemoveCommand(const char *pCommand)
    {
        for(int i = 0; i < m_aCommands.size(); i++)
        {
            if(!str_comp(m_aCommands[i].m_aName, pCommand))
            {
                if(m_pfnRemoveCommandHook)
                    m_pfnRemoveCommandHook(&m_aCommands[i], m_pHookContext);

                m_aCommands.remove_index(i);
                return 0;
            }
        }

        return 1;
    }